

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_converter.cpp
# Opt level: O0

void duckdb::ArrowConverter::ToArrowSchema
               (ArrowSchema *out_schema,vector<duckdb::LogicalType,_true> *types,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,ClientProperties *options)

{
  size_type sVar1;
  reference pvVar2;
  reference ppAVar3;
  ArrowSchema **ppAVar4;
  long lVar5;
  pointer pDVar6;
  DuckDBArrowSchemaHolder *root_holder_00;
  type child_00;
  const_reference name;
  value_type *in_RCX;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RSI;
  undefined8 *in_RDI;
  value_type *child;
  idx_t col_idx;
  size_t i;
  templated_unique_single_t root_holder;
  idx_t column_count;
  ClientContext *in_stack_00000440;
  ClientProperties *in_stack_00000448;
  LogicalType *in_stack_00000450;
  ArrowSchema *in_stack_00000458;
  DuckDBArrowSchemaHolder *in_stack_00000460;
  value_type *in_stack_fffffffffffffee8;
  ClientContext *in_stack_fffffffffffffef0;
  size_type in_stack_ffffffffffffff08;
  vector<ArrowSchema,_std::allocator<ArrowSchema>_> *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_> *in_stack_ffffffffffffff20;
  string *name_00;
  ulong local_58;
  ulong local_50;
  
  sVar1 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size(in_RSI);
  make_uniq<duckdb::DuckDBArrowSchemaHolder>();
  unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
  ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                *)in_stack_fffffffffffffef0);
  ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
  ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                *)in_stack_fffffffffffffef0);
  ::std::vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>::resize
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (value_type *)in_stack_ffffffffffffff10);
  for (local_50 = 0; local_50 < sVar1; local_50 = local_50 + 1) {
    unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
    ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                  *)in_stack_fffffffffffffef0);
    pvVar2 = vector<ArrowSchema,_true>::operator[]
                       ((vector<ArrowSchema,_true> *)in_stack_fffffffffffffef0,
                        (size_type)in_stack_fffffffffffffee8);
    unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
    ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                  *)in_stack_fffffffffffffef0);
    ppAVar3 = vector<ArrowSchema_*,_true>::operator[]
                        ((vector<ArrowSchema_*,_true> *)in_stack_fffffffffffffef0,
                         (size_type)in_stack_fffffffffffffee8);
    *ppAVar3 = pvVar2;
  }
  unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
  ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                *)in_stack_fffffffffffffef0);
  ppAVar4 = ::std::vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>::data
                      ((vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_> *)0x15231b8);
  in_RDI[5] = ppAVar4;
  lVar5 = NumericCast<long,unsigned_long,void>(0x15231d4);
  in_RDI[4] = lVar5;
  *in_RDI = "+s";
  in_RDI[3] = 0;
  in_RDI[2] = 0;
  in_RDI[1] = "duckdb_query_result";
  in_RDI[6] = 0;
  for (local_58 = 0; local_58 < sVar1; local_58 = local_58 + 1) {
    pDVar6 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
             ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                           *)in_stack_fffffffffffffef0);
    name_00 = (string *)&pDVar6->owned_column_names;
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
    AddName(name_00);
    ::std::
    vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
    ::push_back((vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
                 *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    unique_ptr<char[],_std::default_delete<char>,_false>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char>,_false> *)0x15232d6);
    unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
    ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                  *)in_stack_fffffffffffffef0);
    root_holder_00 =
         (DuckDBArrowSchemaHolder *)
         vector<ArrowSchema,_true>::operator[]
                   ((vector<ArrowSchema,_true> *)in_stack_fffffffffffffef0,
                    (size_type)in_stack_fffffffffffffee8);
    child_00 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator*((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                            *)in_stack_fffffffffffffef0);
    name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
    InitializeChild((ArrowSchema *)child_00,root_holder_00,name);
    unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
    ::operator*((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                 *)in_stack_fffffffffffffef0);
    vector<duckdb::LogicalType,_true>::operator[]
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffef0,
               (size_type)in_stack_fffffffffffffee8);
    in_stack_fffffffffffffee8 = in_RCX;
    in_stack_fffffffffffffef0 =
         optional_ptr<duckdb::ClientContext,_true>::operator*
                   ((optional_ptr<duckdb::ClientContext,_true> *)in_stack_fffffffffffffef0);
    SetArrowFormat(in_stack_00000460,in_stack_00000458,in_stack_00000450,in_stack_00000448,
                   in_stack_00000440);
  }
  pDVar6 = ::std::
           unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
           ::release((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
                      *)0x1523426);
  in_RDI[8] = pDVar6;
  in_RDI[7] = ReleaseDuckDBArrowSchema;
  unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
  ::~unique_ptr((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                 *)0x1523455);
  return;
}

Assistant:

void ArrowConverter::ToArrowSchema(ArrowSchema *out_schema, const vector<LogicalType> &types,
                                   const vector<string> &names, ClientProperties &options) {
	D_ASSERT(out_schema);
	D_ASSERT(types.size() == names.size());
	const idx_t column_count = types.size();
	// Allocate as unique_ptr first to clean-up properly on error
	auto root_holder = make_uniq<DuckDBArrowSchemaHolder>();

	// Allocate the children
	root_holder->children.resize(column_count);
	root_holder->children_ptrs.resize(column_count, nullptr);
	for (size_t i = 0; i < column_count; ++i) {
		root_holder->children_ptrs[i] = &root_holder->children[i];
	}
	out_schema->children = root_holder->children_ptrs.data();
	out_schema->n_children = NumericCast<int64_t>(column_count);

	// Store the schema
	out_schema->format = "+s"; // struct apparently
	out_schema->flags = 0;
	out_schema->metadata = nullptr;
	out_schema->name = "duckdb_query_result";
	out_schema->dictionary = nullptr;

	// Configure all child schemas
	for (idx_t col_idx = 0; col_idx < column_count; col_idx++) {
		root_holder->owned_column_names.push_back(AddName(names[col_idx]));
		auto &child = root_holder->children[col_idx];
		InitializeChild(child, *root_holder, names[col_idx]);
		SetArrowFormat(*root_holder, child, types[col_idx], options, *options.client_context);
	}

	// Release ownership to caller
	out_schema->private_data = root_holder.release();
	out_schema->release = ReleaseDuckDBArrowSchema;
}